

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam000000000016c5c0 = 0x2d2d2d2d2d2d2d;
    uRam000000000016c5c7 = 0x2d2d2d2d2d2d2d2d;
    _DAT_0016c5b0 = 0x2d2d2d2d2d2d2d2d;
    uRam000000000016c5b8 = 0x2d2d2d2d2d2d2d;
    DAT_0016c5bf = 0x2d;
    _DAT_0016c5a0 = 0x2d2d2d2d2d2d2d2d;
    uRam000000000016c5a8 = 0x2d2d2d2d2d2d2d2d;
    _DAT_0016c590 = 0x2d2d2d2d2d2d2d2d;
    uRam000000000016c598 = 0x2d2d2d2d2d2d2d2d;
    _line = 0x2d2d2d2d2d2d2d2d;
    uRam000000000016c588 = 0x2d2d2d2d2d2d2d2d;
    DAT_0016c5cf = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void printSummaryDivider() {
            stream << getLineOfChars<'-'>() << "\n";
        }